

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::Uniform::setName(Uniform *this,string *parentName,string *_name)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference this_00;
  string local_500;
  string local_4e0;
  undefined1 local_4c0 [8];
  ostringstream childParentName;
  ostringstream childName;
  size_t i;
  ostringstream local_198 [8];
  ostringstream __name;
  string *_name_local;
  string *parentName_local;
  Uniform *this_local;
  
  __name._368_8_ = _name;
  std::__cxx11::string::operator=((string *)&this->shortName,(string *)_name);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,(string *)parentName);
  std::operator<<(poVar2,(string *)__name._368_8_);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->name,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  bVar1 = UniformType::isStruct(&this->type);
  if (bVar1) {
    for (childName._368_8_ = 0;
        sVar3 = std::
                vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                ::size(&this->childUniforms), (ulong)childName._368_8_ < sVar3;
        childName._368_8_ = childName._368_8_ + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&childParentName.field_0x170);
      poVar2 = std::operator<<((ostream *)&childParentName.field_0x170,"m");
      sVar3 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::size(&this->childUniforms);
      std::ostream::operator<<
                (poVar2,(ulong)childName._368_8_ % (sVar3 / (ulong)(long)(this->type).arraySize));
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
      std::operator<<((ostream *)local_4c0,(string *)&this->name);
      UniformType::streamArrayStr
                (&this->type,(ostringstream *)local_4c0,
                 (int)((ulong)childName._368_8_ / (ulong)(long)(this->type).arraySize));
      std::operator<<((ostream *)local_4c0,".");
      this_00 = std::
                vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                ::operator[](&this->childUniforms,childName._368_8_);
      std::__cxx11::ostringstream::str();
      std::__cxx11::ostringstream::str();
      setName(this_00,&local_4e0,&local_500);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&childParentName.field_0x170);
    }
  }
  return;
}

Assistant:

void setName(const std::string& parentName, const std::string& _name)
	{
		shortName = _name;
		{
			std::ostringstream __name;
			__name << parentName << _name;
			name = __name.str();
		}
		if (type.isStruct())
		{
			for (size_t i = 0; i < childUniforms.size(); i++)
			{
				std::ostringstream childName;
				childName << "m" << (i % (childUniforms.size() / type.arraySize));
				std::ostringstream childParentName;
				childParentName << name;
				type.streamArrayStr(childParentName, (int)(i / type.arraySize));
				childParentName << ".";
				childUniforms[i].setName(childParentName.str(), childName.str());
			}
		}
	}